

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int declarator(sym_t *s)

{
  int iVar1;
  socklen_t *extraout_RDX;
  socklen_t *__addr_len;
  socklen_t *extraout_RDX_00;
  socklen_t *extraout_RDX_01;
  socklen_t *extraout_RDX_02;
  char *__addr;
  
  if (t->id != 0x86) {
    return 0;
  }
  __addr = t->string;
  strcpy(s->id,__addr);
  next();
  __addr_len = extraout_RDX;
LAB_00105663:
  do {
    if (t->id != 0x28) {
      return 1;
    }
    iVar1 = accept(0x28,(sockaddr *)__addr,__addr_len);
    __addr_len = extraout_RDX_00;
  } while (iVar1 == 0);
  if (s->function == 0) goto LAB_0010569b;
  __addr = "\'%s\' declared as a function returning a function";
  err(E,"\'%s\' declared as a function returning a function",s);
  goto LAB_00105691;
LAB_0010569b:
  s->function = 1;
  iVar1 = expect(0x29);
  __addr_len = extraout_RDX_02;
  if (iVar1 == 0) {
LAB_00105691:
    sync();
    __addr_len = extraout_RDX_01;
  }
  goto LAB_00105663;
}

Assistant:

int direct_declarator(sym_t* s)
{
    if (t->id == IDENTIFIER)
    {
        strcpy(s->id, t->string);
        next();

        while (/* t->id == '[' || */ t->id == '(' )
        {
            /* if (t->id == '[')
            {
            }
            else */ if (accept('('))
            {

                if (s->function)
                {
                    err(E, "'%s' declared as a function returning a function", s->id);
                    sync(")");
                }
                else
                {
                    s->function = 1;
                    if (expect(')'))
                        ;
                    else
                        sync(")");
                }
            }

        }

        return 1;
    }
    /*
    else if (t->id == '(')
    {
        declarator etc
        if (t->id == '['
    }

    */
    return 0;
}